

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void * NULLC::AssertDerivedFrom(uint *derived,uint base)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  
  if (derived != (uint *)0x0) {
    uVar3 = *derived;
    do {
      if (uVar3 == base) {
        return derived;
      }
      if (*(uint *)(linker + 0x20c) <= uVar3) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      uVar3 = *(uint *)(*(long *)(linker + 0x200) + 0x4c + (ulong)uVar3 * 0x50);
    } while (uVar3 != 0);
    pcVar1 = nullcGetTypeName(*derived);
    pcVar2 = nullcGetTypeName(base);
    nullcThrowError("ERROR: cannot convert from \'%s\' to \'%s\'",pcVar1,pcVar2);
  }
  return derived;
}

Assistant:

void* NULLC::AssertDerivedFrom(unsigned* derived, unsigned base)
{
	if(!derived)
		return derived;

	unsigned typeId = *derived;

	for(;;)
	{
		if(base == typeId)
			return derived;

		if(linker->exTypes[typeId].baseType)
		{
			typeId = linker->exTypes[typeId].baseType;
		}
		else
		{
			break;
		}
	}

	nullcThrowError("ERROR: cannot convert from '%s' to '%s'", nullcGetTypeName(*derived), nullcGetTypeName(base));
	return derived;
}